

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpLexer.cpp
# Opt level: O0

void __thiscall GrpLexer::mSQUOTE(GrpLexer *this,bool _createToken)

{
  int iVar1;
  undefined8 uVar2;
  byte in_SIL;
  long *in_RDI;
  size_type _begin;
  RefToken _token;
  int _ttype;
  char *in_stack_ffffffffffffff00;
  long *plVar3;
  string *in_stack_ffffffffffffff08;
  ScannerException *in_stack_ffffffffffffff10;
  Token *in_stack_ffffffffffffff18;
  Token *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  RefCount<Token> *in_stack_ffffffffffffff30;
  string local_a0 [32];
  undefined1 local_80 [14];
  undefined1 local_72;
  allocator local_71;
  string local_70 [80];
  undefined8 local_20;
  RefCount<Token> local_18;
  int local_10;
  byte local_9;
  
  local_9 = in_SIL & 1;
  RefCount<Token>::RefCount
            (in_stack_ffffffffffffff30,
             (Token *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  local_20 = std::__cxx11::string::length();
  local_10 = 0x6d;
  iVar1 = (**(code **)(*in_RDI + 0x90))(in_RDI,1);
  if (iVar1 == 0x27) {
    (**(code **)(*in_RDI + 0xa8))(in_RDI,0x27);
  }
  else if (iVar1 == 0x91) {
    (**(code **)(*in_RDI + 0xa8))(in_RDI,0x91);
  }
  else {
    if (iVar1 != 0x92) {
      local_72 = 1;
      uVar2 = __cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_70,"no viable alt for char: ",&local_71);
      iVar1 = (**(code **)(*in_RDI + 0x90))(in_RDI,1);
      CharScanner::charName(iVar1);
      std::operator+(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
      iVar1 = (int)((ulong)in_stack_ffffffffffffff00 >> 0x20);
      (**(code **)(*in_RDI + 0x78))();
      ScannerException::ScannerException(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,iVar1);
      local_72 = 0;
      __cxa_throw(uVar2,&ScannerException::typeinfo,ScannerException::~ScannerException);
    }
    (**(code **)(*in_RDI + 0xa8))(in_RDI,0x92);
  }
  if ((local_9 & 1) != 0) {
    in_stack_ffffffffffffff20 = RefCount::operator_cast_to_Token_((RefCount *)&local_18);
    in_stack_ffffffffffffff18 = RefCount::operator_cast_to_Token_((RefCount *)&nullToken);
    if ((in_stack_ffffffffffffff20 == in_stack_ffffffffffffff18) && (local_10 != -1)) {
      (**(code **)(*in_RDI + 0x98))(local_80,in_RDI,local_10);
      RefCount<Token>::operator=
                ((RefCount<Token> *)in_stack_ffffffffffffff20,
                 (RefCount<Token> *)in_stack_ffffffffffffff18);
      RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_ffffffffffffff10);
      in_stack_ffffffffffffff10 = (ScannerException *)RefCount<Token>::operator->(&local_18);
      plVar3 = in_RDI + 1;
      std::__cxx11::string::length();
      std::__cxx11::string::substr((ulong)local_a0,(ulong)plVar3);
      (*(*(_func_int ***)&in_stack_ffffffffffffff10->super_ANTLRException)[6])
                (in_stack_ffffffffffffff10,local_a0);
      std::__cxx11::string::~string(local_a0);
    }
  }
  RefCount<Token>::operator=
            ((RefCount<Token> *)in_stack_ffffffffffffff20,
             (RefCount<Token> *)in_stack_ffffffffffffff18);
  RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_ffffffffffffff10);
  return;
}

Assistant:

void GrpLexer::mSQUOTE(bool _createToken) {
	int _ttype; RefToken _token; auto _begin=text.length();
	_ttype = SQUOTE;
	
	{
	switch ( LA(1)) {
	case static_cast<unsigned char>('\''):
	{
		match(static_cast<unsigned char>('\''));
		break;
	}
	case static_cast<unsigned char>('\221'):
	{
		match(static_cast<unsigned char>('\221'));
		break;
	}
	case static_cast<unsigned char>('\222'):
	{
		match(static_cast<unsigned char>('\222'));
		break;
	}
	default:
	{
		throw ScannerException(std::string("no viable alt for char: ")+charName(LA(1)),getLine());
	}
	}
	}
	if ( _createToken && _token==nullToken && _ttype!=Token::SKIP ) {
	   _token = makeToken(_ttype);
	   _token->setText(text.substr(_begin, text.length()-_begin));
	}
	_returnToken = _token;
}